

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cymric.cpp
# Opt level: O0

int read_file(char *path,uint8_t *buffer,int bytes)

{
  int __fd;
  uint uVar1;
  ssize_t sVar2;
  int in_EDX;
  void *in_RSI;
  char *in_RDI;
  int flags;
  int fd;
  int len;
  int retries;
  int completed;
  int local_20;
  int local_1c;
  int local_18;
  void *local_10;
  
  local_18 = 0;
  local_1c = 100;
  local_10 = in_RSI;
  do {
    local_20 = in_EDX - local_18;
    __fd = open(in_RDI,0);
    if (-1 < __fd) {
      uVar1 = fcntl(__fd,3,0);
      fcntl(__fd,4,(ulong)(uVar1 | 0x800));
      sVar2 = read(__fd,local_10,(long)local_20);
      local_20 = (int)sVar2;
      close(__fd);
    }
    if (local_20 < 1) {
      local_1c = local_1c + -1;
      if (local_1c < 0) {
        return local_18;
      }
    }
    else {
      local_18 = local_20 + local_18;
      local_10 = (void *)((long)local_10 + (long)local_20);
    }
  } while (local_18 < in_EDX);
  return local_18;
}

Assistant:

static int read_file(const char *path, uint8_t *buffer, int bytes) {
    int completed = 0, retries = 100;

    do {
        int len = bytes - completed;

        // Attempt to open the file
        int fd = open(path, O_RDONLY);
        if (fd >= 0) {
            // Set non-blocking mode
            int flags = fcntl(fd, F_GETFL, 0);
            fcntl(fd, F_SETFL, flags | O_NONBLOCK);

            // Launch read request and close file
            len = read(fd, buffer, len);
            close(fd);
        }

        // If read request failed (ie. blocking):
        if (len <= 0) {
            if (--retries >= 0) {
                continue;
            } else {
                // Give up
                break;
            }
        }

        // Subtract off the read byte count from request size
        completed += len;
        buffer += len;
    } while (completed < bytes);

    // Return number of bytes completed
    return completed;
}